

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_layout.cpp
# Opt level: O0

void apply_w_h_cw_ch_r_c_m_s
               (LayoutNode *node,float width,float height,float cellWidth,float cellHeight,
               int rowCount,int columnCount,float margin,float spacing)

{
  float spacing_local;
  float margin_local;
  int columnCount_local;
  int rowCount_local;
  float cellHeight_local;
  float cellWidth_local;
  float height_local;
  float width_local;
  LayoutNode *node_local;
  
  rengine::LayoutNode::setWidth(node,width);
  rengine::LayoutNode::setHeight(node,height);
  rengine::LayoutNode::setCellWidth(node,cellWidth);
  rengine::LayoutNode::setCellHeight(node,cellHeight);
  rengine::LayoutNode::setRowCount(node,rowCount);
  rengine::LayoutNode::setColumnCount(node,columnCount);
  rengine::LayoutNode::setSpacing(node,spacing);
  rengine::LayoutNode::setMargin(node,margin);
  rengine::LayoutNode::updateLayout(node);
  return;
}

Assistant:

static void apply_w_h_cw_ch_r_c_m_s(LayoutNode *node, float width, float height, float cellWidth, float cellHeight, int rowCount, int columnCount, float margin, float spacing)
{
    node->setWidth(width);
    node->setHeight(height);
    node->setCellWidth(cellWidth);
    node->setCellHeight(cellHeight);
    node->setRowCount(rowCount);
    node->setColumnCount(columnCount);
    node->setSpacing(spacing);
    node->setMargin(margin);

    node->updateLayout();
}